

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

bool __thiscall llvm::ItaniumPartialDemangler::hasFunctionQualifiers(ItaniumPartialDemangler *this)

{
  void *pvVar1;
  
  pvVar1 = this->RootNode;
  if (pvVar1 == (void *)0x0) {
    __assert_fail("RootNode != nullptr && \"must call partialDemangle()\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Demangle/ItaniumDemangle.cpp"
                  ,0x1432,"bool llvm::ItaniumPartialDemangler::hasFunctionQualifiers() const");
  }
  if (*(char *)((long)pvVar1 + 8) == '\x12') {
    if (*(int *)((long)pvVar1 + 0x38) != 0) {
      return true;
    }
    return *(char *)((long)pvVar1 + 0x3c) != '\0';
  }
  return false;
}

Assistant:

bool ItaniumPartialDemangler::hasFunctionQualifiers() const {
  assert(RootNode != nullptr && "must call partialDemangle()");
  if (!isFunction())
    return false;
  auto *E = static_cast<FunctionEncoding *>(RootNode);
  return E->getCVQuals() != QualNone || E->getRefQual() != FrefQualNone;
}